

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

void Dau_DecTrySets(word *pInit,int nVars,int fVerbose)

{
  uint uVar1;
  uint set;
  int *piVar2;
  Vec_Int_t *__ptr;
  uint uSet;
  ulong uVar3;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauNonDsd.c"
                  ,0x343,"void Dau_DecTrySets(word *, int, int)");
  }
  __ptr = Dau_DecFindSets(pInit,nVars);
  if (fVerbose != 0) {
    Dau_DsdPrintFromTruth(pInit,nVars);
    uVar1 = __ptr->nSize;
    printf("This %d-variable function has %d decomposable variable sets:\n",(ulong)(uint)nVars,
           (ulong)uVar1);
    if (0 < (long)(int)uVar1) {
      piVar2 = __ptr->pArray;
      uVar3 = 0;
      do {
        set = piVar2[uVar3];
        printf("Set %4d : ",uVar3 & 0xffffffff);
        if (nVars < 7) {
          Dau_DecPrintSet(set,nVars,1);
          Dau_DecPerform6(pInit,nVars,set);
        }
        else {
          Dau_DecPrintSet(set,nVars,0);
          Dau_DecPerform(pInit,nVars,set);
        }
        uVar3 = uVar3 + 1;
      } while ((long)(int)uVar1 != uVar3);
    }
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Dau_DecTrySets( word * pInit, int nVars, int fVerbose )
{
    Vec_Int_t * vSets;
    int i, Entry;
    assert( nVars <= 16 );
    vSets = Dau_DecFindSets( pInit, nVars );
    if ( !fVerbose )
    {
        Vec_IntFree( vSets );
        return;
    }
    Dau_DsdPrintFromTruth( pInit, nVars ); 
    printf( "This %d-variable function has %d decomposable variable sets:\n", nVars, Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Entry, i )
    {
        unsigned uSet = (unsigned)Entry;
        printf( "Set %4d : ", i );
        if ( nVars > 6 )
        {
            Dau_DecPrintSet( uSet, nVars, 0 );
            Dau_DecPerform( pInit, nVars, uSet );
        }
        else
        {
            Dau_DecPrintSet( uSet, nVars, 1 );
            Dau_DecPerform6( pInit, nVars, uSet );
        }
    }
    Vec_IntFree( vSets );
//    printf( "\n" );
}